

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
 __thiscall ninx::parser::Parser::parse_value(Parser *this)

{
  int iVar1;
  ParserException *pPVar2;
  Token *pTVar3;
  string *psVar4;
  string *in_RSI;
  Variable *local_150;
  allocator local_d1;
  string local_d0;
  Token *local_b0;
  Token *error_token_1;
  undefined1 local_a0 [8];
  int local_98 [2];
  string name;
  Variable *variable_token;
  string local_68;
  Token *local_48;
  Token *error_token;
  undefined1 local_38 [24];
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_20;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  value;
  Parser *this_local;
  
  std::
  unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
  ::unique_ptr<std::default_delete<ninx::parser::element::Expression>,void>
            ((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
              *)&local_20,(nullptr_t)0x0);
  iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'{');
  if (iVar1 == 1) {
    parse_block((Parser *)local_38);
    std::
    unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
    ::operator=((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
                 *)&local_20,
                (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_38);
    std::
    unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>::
    ~unique_ptr((unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                 *)local_38);
  }
  else {
    iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'(');
    if (iVar1 != 1) {
      pTVar3 = TokenReader::peek_token((TokenReader *)(in_RSI + 1));
      if (pTVar3 != (Token *)0x0) {
        pTVar3 = TokenReader::peek_token((TokenReader *)(in_RSI + 1));
        iVar1 = (*pTVar3->_vptr_Token[2])();
        if (iVar1 == 3) {
          pTVar3 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
          if (pTVar3 == (Token *)0x0) {
            local_150 = (Variable *)0x0;
          }
          else {
            local_150 = (Variable *)
                        __dynamic_cast(pTVar3,&lexer::token::Token::typeinfo,
                                       &lexer::token::Variable::typeinfo,0);
          }
          name.field_2._8_8_ = local_150;
          psVar4 = lexer::token::Variable::get_name_abi_cxx11_(local_150);
          std::__cxx11::string::string((string *)local_98,(string *)psVar4);
          error_token_1._4_4_ =
               lexer::token::Variable::get_trailing_spaces((Variable *)name.field_2._8_8_);
          std::make_unique<ninx::parser::element::VariableRead,std::__cxx11::string&,int>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     local_98);
          std::
          unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
          ::operator=((unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>
                       *)&local_20,
                      (unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
                       *)local_a0);
          std::
          unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
          ::~unique_ptr((unique_ptr<ninx::parser::element::VariableRead,_std::default_delete<ninx::parser::element::VariableRead>_>
                         *)local_a0);
          std::__cxx11::string::~string((string *)local_98);
          goto LAB_0014dda7;
        }
      }
      local_b0 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x20);
      pTVar3 = local_b0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d0,"Expected Block or Variable.",&local_d1);
      exception::ParserException::ParserException(pPVar2,pTVar3,in_RSI,&local_d0);
      __cxa_throw(pPVar2,&exception::ParserException::typeinfo,
                  exception::ParserException::~ParserException);
    }
    TokenReader::get_token((TokenReader *)(in_RSI + 1));
    parse_expression((Parser *)&error_token);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::operator=(&local_20,
                (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)&error_token);
    std::
    unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
    ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                   *)&error_token);
    iVar1 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),')');
    if (iVar1 != 1) {
      local_48 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
      variable_token._6_1_ = 1;
      pPVar2 = (ParserException *)__cxa_allocate_exception(0x20);
      pTVar3 = local_48;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_68,"Expected closing parethesis \')\'",
                 (allocator *)((long)&variable_token + 7));
      exception::ParserException::ParserException(pPVar2,pTVar3,in_RSI,&local_68);
      variable_token._6_1_ = 0;
      __cxa_throw(pPVar2,&exception::ParserException::typeinfo,
                  exception::ParserException::~ParserException);
    }
    TokenReader::get_token((TokenReader *)(in_RSI + 1));
  }
LAB_0014dda7:
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                *)this,&local_20);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Expression> ninx::parser::Parser::parse_value() {
    std::unique_ptr<Expression> value{nullptr};

    // Check if is a block value or a variable read
    if (reader.check_limiter('{') == 1) {
        value = parse_block();
    } else if (reader.check_limiter('(') == 1) {  // Nested expression
        // Consume the open parenthesis
        reader.get_token();

        value = parse_expression();

        // Check and consume the closing parenthesis
        if (reader.check_limiter(')') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Expected closing parethesis ')'");
        }
        reader.get_token();

    } else if (reader.peek_token() != nullptr && reader.peek_token()->get_type() == Type::VARIABLE) {
        // Get the variable name
        auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(reader.get_token())};
        auto name{variable_token->get_name()};
        value = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
    } else {
        auto error_token{reader.get_token()};
        throw ParserException(error_token, this->origin, "Expected Block or Variable.");
    }

    return std::move(value);
}